

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# crn_dxt_image.cpp
# Opt level: O3

bool __thiscall crnlib::dxt_image::has_alpha(dxt_image *this)

{
  dxt_format dVar1;
  element *peVar2;
  int iVar3;
  ulong uVar4;
  uint y;
  long lVar5;
  
  dVar1 = this->m_format;
  if ((uint)dVar1 < 0xc) {
    if ((0xa1eU >> (dVar1 & 0x1f) & 1) != 0) {
      return true;
    }
    if ((dVar1 == cDXT1) && ((ulong)this->m_total_elements != 0)) {
      peVar2 = this->m_pElements;
      uVar4 = 0;
      do {
        if (*(ushort *)peVar2[uVar4].m_bytes <= *(ushort *)(peVar2[uVar4].m_bytes + 2)) {
          lVar5 = 0;
          do {
            iVar3 = 0;
            do {
              if ((~(peVar2[uVar4].m_bytes[lVar5 + 4] >> ((byte)iVar3 & 0x1f)) & 3) == 0) {
                return true;
              }
              iVar3 = iVar3 + 2;
            } while (iVar3 != 8);
            lVar5 = lVar5 + 1;
          } while (lVar5 != 4);
        }
        uVar4 = uVar4 + 1;
      } while (uVar4 != this->m_total_elements);
    }
  }
  return false;
}

Assistant:

bool dxt_image::has_alpha() const {
  switch (m_format) {
    case cDXT1: {
      for (uint i = 0; i < m_total_elements; i++) {
        const dxt1_block& blk = *(dxt1_block*)&m_pElements[i];

        if (blk.get_low_color() <= blk.get_high_color()) {
          for (uint y = 0; y < cDXTBlockSize; y++)
            for (uint x = 0; x < cDXTBlockSize; x++)
              if (blk.get_selector(x, y) == 3)
                return true;
        }
      }

      break;
    }
    case cDXT1A:
    case cDXT3:
    case cDXT5:
    case cDXT5A:
    case cETC2A:
    case cETC2AS:
      return true;
    default:
      break;
  }

  return false;
}